

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_recorder.h
# Opt level: O0

void __thiscall
absl::lts_20240722::profiling_internal::
SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>::SampleRecorder
          (SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *this)

{
  MutexLock local_18;
  MutexLock l;
  SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *this_local;
  
  l.mu_ = (Mutex *)this;
  std::atomic<unsigned_long>::atomic(&this->dropped_samples_,0);
  std::atomic<unsigned_long>::atomic(&this->size_estimate_,0);
  std::atomic<unsigned_long>::atomic(&this->max_samples_,0x100000);
  std::atomic<absl::lts_20240722::container_internal::HashtablezInfo_*>::atomic
            (&this->all_,(__pointer_type)0x0);
  container_internal::HashtablezInfo::HashtablezInfo(&this->graveyard_);
  std::atomic<void_(*)(const_absl::lts_20240722::container_internal::HashtablezInfo_&)>::atomic
            (&this->dispose_,(__pointer_type)0x0);
  MutexLock::MutexLock(&local_18,(Mutex *)&this->graveyard_);
  (this->graveyard_).super_Sample<absl::lts_20240722::container_internal::HashtablezInfo>.dead =
       &this->graveyard_;
  MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

SampleRecorder<T>::SampleRecorder()
    : dropped_samples_(0), size_estimate_(0), all_(nullptr), dispose_(nullptr) {
  absl::MutexLock l(&graveyard_.init_mu);
  graveyard_.dead = &graveyard_;
}